

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAnimatedMeshSceneNode.cpp
# Opt level: O0

void __thiscall
irr::scene::CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode(CAnimatedMeshSceneNode *this,void **vtt)

{
  undefined8 *in_RSI;
  IAnimatedMeshSceneNode *in_RDI;
  IReferenceCounted *in_stack_ffffffffffffffd8;
  
  (in_RDI->super_ISceneNode)._vptr_ISceneNode = (_func_int **)*in_RSI;
  *(undefined8 *)
   ((in_RDI->super_ISceneNode)._vptr_ISceneNode[-3] + -0x30 +
   (long)(in_RDI->super_ISceneNode).AbsoluteTransformation.M) = in_RSI[5];
  if (*(long *)(in_RDI[1].super_ISceneNode.AbsoluteTransformation.M + 8) != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  if (*(long *)((long)&in_RDI[1].super_ISceneNode.Name.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload + 0x18) != 0) {
    IReferenceCounted::drop(in_stack_ffffffffffffffd8);
  }
  core::array<irr::core::CMatrix4<float>_>::~array((array<irr::core::CMatrix4<float>_> *)0x2c67e1);
  core::array<irr::scene::IBoneSceneNode_*>::~array((array<irr::scene::IBoneSceneNode_*> *)0x2c67f2)
  ;
  core::array<irr::video::SMaterial>::~array((array<irr::video::SMaterial> *)0x2c6803);
  IAnimatedMeshSceneNode::~IAnimatedMeshSceneNode
            (in_RDI,&in_stack_ffffffffffffffd8->_vptr_IReferenceCounted);
  return;
}

Assistant:

CAnimatedMeshSceneNode::~CAnimatedMeshSceneNode()
{
	if (LoopCallBack)
		LoopCallBack->drop();
	if (Mesh)
		Mesh->drop();
}